

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileMe(void)

{
  CompileType<char>();
  CompileType<unsigned_char>();
  CompileType<signed_char>();
  CompileType<unsigned_short>();
  CompileType<short>();
  CompileType<unsigned_int>();
  CompileType<int>();
  CompileType<unsigned_long>();
  CompileType<long>();
  CompileType<unsigned_long_long>();
  CompileType<long_long>();
  CompileSigned<signed_char>();
  CompileSigned<short>();
  CompileSigned<int>();
  CompileSigned<long>();
  CompileSigned<long_long>();
  return;
}

Assistant:

void CompileMe()
{
	CompileType<char>();
	CompileType<unsigned char>();
	CompileType<signed char>();

	CompileType<unsigned short>();
	CompileType<signed short>();
	CompileType<unsigned int>();
	CompileType<signed int>();
	CompileType<unsigned long>();
	CompileType<signed long>();
	CompileType<unsigned long long>();
	CompileType<signed long long>();

	CompileSigned<signed char>();
	CompileSigned<signed short>();
	CompileSigned<signed int>();
	CompileSigned<signed long>();
	CompileSigned<signed long long>();
	MoveRegression();
}